

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpcode.c
# Opt level: O2

void addcharset(CompileState *compst,byte *cs)

{
  int iVar1;
  long lVar2;
  int iVar3;
  bool bVar4;
  
  iVar1 = compst->ncode;
  iVar3 = 8;
  while (bVar4 = iVar3 != 0, iVar3 = iVar3 + -1, bVar4) {
    nextinstruction(compst);
  }
  for (lVar2 = 0; lVar2 != 0x20; lVar2 = lVar2 + 1) {
    compst->p->code->buff[lVar2 + (long)iVar1 * 4] = cs[lVar2];
  }
  return;
}

Assistant:

static void addcharset (CompileState *compst, const byte *cs) {
  int p = gethere(compst);
  int i;
  for (i = 0; i < (int)CHARSETINSTSIZE - 1; i++)
    nextinstruction(compst);  /* space for buffer */
  /* fill buffer with charset */
  loopset(j, getinstr(compst, p).buff[j] = cs[j]);
}